

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_list(CrispyValue *value,Vm *vm)

{
  ObjectType OVar1;
  uint64_t uVar2;
  ObjList *object;
  CrispyValue *pCVar3;
  ObjString *pOVar4;
  CrispyValue CVar5;
  undefined4 uStack_4c;
  uint local_3c;
  uint32_t i;
  ObjList *list;
  ObjString *string;
  Vm *vm_local;
  CrispyValue *value_local;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_10;
  
  if (value->type == OBJECT) {
    OVar1 = ((value->field_1).o_value)->type;
    if (OVar1 == OBJ_STRING) {
      uVar2 = (value->field_1).p_value;
      object = new_list(vm,*(size_t *)(uVar2 + 0x10));
      for (local_3c = 0; (ulong)local_3c < *(ulong *)(uVar2 + 0x10); local_3c = local_3c + 1) {
        pCVar3 = (object->content).values + local_3c;
        pOVar4 = new_string(vm,(char *)(*(long *)(uVar2 + 0x18) + (ulong)local_3c),1);
        CVar5 = create_object(&pOVar4->object);
        *(ulong *)pCVar3 = CONCAT44(uStack_4c,CVar5.type);
        (pCVar3->field_1).p_value = (uint64_t)CVar5.field_1;
      }
      CVar5 = create_object(&object->object);
      local_10 = CVar5.field_1;
      value_local = (CrispyValue *)(ulong)CVar5.type;
    }
    else if (OVar1 == OBJ_LIST) {
      value_local = *(CrispyValue **)value;
      local_10 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(value->field_1).p_value;
    }
    else {
      vm->err_flag = true;
      pOVar4 = new_string(vm,"Invalid type for list()",0x17);
      CVar5 = create_object(&pOVar4->object);
      local_10 = CVar5.field_1;
      value_local = (CrispyValue *)(ulong)CVar5.type;
    }
  }
  else {
    vm->err_flag = true;
    pOVar4 = new_string(vm,"Invalid type for list()",0x17);
    CVar5 = create_object(&pOVar4->object);
    local_10 = CVar5.field_1;
    value_local = (CrispyValue *)(ulong)CVar5.type;
  }
  CVar5._0_8_ = (ulong)value_local & 0xffffffff;
  CVar5.field_1.d_value = local_10.d_value;
  return CVar5;
}

Assistant:

CrispyValue std_list(CrispyValue *value, Vm *vm) {
    switch (value[0].type) {
        case OBJECT:
            switch (value->o_value->type) {
                case OBJ_LIST:
                    return *value;
                case OBJ_STRING: {
                    ObjString *string = (ObjString *) value->o_value;
                    ObjList *list = new_list(vm, string->length);

                    for (uint32_t i = 0; i < string->length; ++i) {
                        list->content.values[i] =
                                create_object((Object *) new_string(vm, string->start + i, 1));
                    }

                    return create_object((Object *) list);
                }
                default:
                    vm->err_flag = true;
                    return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
            }
        default:
            vm->err_flag = true;
            return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
    }
}